

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.hpp
# Opt level: O3

void __thiscall
OpenMD::TorsionStamp::setMembers(TorsionStamp *this,tuple<int,_int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  iterator iVar2;
  _Tuple_impl<2UL,_int,_int> local_28;
  undefined8 uStack_20;
  
  local_28 = (tuple->super__Tuple_impl<0UL,_int,_int,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
  uStack_20 = *(undefined8 *)
               &(tuple->super__Tuple_impl<0UL,_int,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>;
  this_00 = &this->members_;
  iVar2._M_current =
       (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar1 = (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar2._M_current == piVar1) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar2,(int *)((long)&uStack_20 + 4));
    iVar2._M_current =
         (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar1 = (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    uStack_20._4_4_ = (int)((ulong)uStack_20 >> 0x20);
    *iVar2._M_current = uStack_20._4_4_;
    iVar2._M_current = iVar2._M_current + 1;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == piVar1) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar2,(int *)&uStack_20);
    iVar2._M_current =
         (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar1 = (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = (int)uStack_20;
    iVar2._M_current = iVar2._M_current + 1;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == piVar1) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar2,
               &local_28.super__Head_base<2UL,_int,_false>._M_head_impl);
    iVar2._M_current =
         (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar1 = (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar2._M_current = local_28.super__Head_base<2UL,_int,_false>._M_head_impl;
    iVar2._M_current = iVar2._M_current + 1;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current;
  }
  if (iVar2._M_current == piVar1) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this_00,iVar2,(int *)&local_28);
  }
  else {
    *iVar2._M_current =
         (int)local_28.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
    (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int, int>& tuple) {
      auto [first, second, third, fourth] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
      members_.push_back(fourth);
    }